

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_8.c
# Opt level: O1

void arr_store_col(int *col,__m256i vH,int32_t t,int32_t seglen,int32_t bias)

{
  int iVar1;
  char in_XMM0_Ba;
  char in_XMM0_Bb;
  char in_XMM0_Bc;
  char in_XMM0_Bd;
  char in_XMM0_Be;
  char in_XMM0_Bf;
  char in_XMM0_Bg;
  char in_XMM0_Bh;
  char in_YMM0_H;
  char in_register_00001211;
  char in_register_00001212;
  char in_register_00001213;
  char in_register_00001214;
  char in_register_00001215;
  char in_register_00001216;
  char in_register_00001217;
  
  col[t] = in_XMM0_Ba + 0x80;
  col[seglen + t] = in_XMM0_Bb + 0x80;
  col[t + seglen * 2] = in_XMM0_Bc + 0x80;
  col[seglen * 3 + t] = in_XMM0_Bd + 0x80;
  col[t + seglen * 4] = in_XMM0_Be + 0x80;
  col[seglen * 5 + t] = in_XMM0_Bf + 0x80;
  col[t + seglen * 6] = in_XMM0_Bg + 0x80;
  col[seglen * 7 + t] = in_XMM0_Bh + 0x80;
  col[t + seglen * 8] = in_XMM0_Ba + 0x80;
  col[seglen * 9 + t] = in_XMM0_Bb + 0x80;
  iVar1 = t + seglen * 10;
  col[iVar1] = in_XMM0_Bc + 0x80;
  col[iVar1 + seglen] = in_XMM0_Bd + 0x80;
  iVar1 = t + seglen * 0xc;
  col[iVar1] = in_XMM0_Be + 0x80;
  col[iVar1 + seglen] = in_XMM0_Bf + 0x80;
  col[seglen * 0xe + t] = in_XMM0_Bg + 0x80;
  col[seglen * 0xf + t] = in_XMM0_Bh + 0x80;
  col[seglen * 0x10 + t] = in_YMM0_H + 0x80;
  col[seglen + t + seglen * 0x10] = in_register_00001211 + 0x80;
  iVar1 = t + seglen * 0x12;
  col[iVar1] = in_register_00001212 + 0x80;
  col[iVar1 + seglen] = in_register_00001213 + 0x80;
  iVar1 = t + seglen * 0x14;
  col[iVar1] = in_register_00001214 + 0x80;
  col[iVar1 + seglen] = in_register_00001215 + 0x80;
  col[iVar1 + seglen * 2] = in_register_00001216 + 0x80;
  col[seglen * 0x17 + t] = in_register_00001217 + 0x80;
  col[t + seglen * 0x18] = in_YMM0_H + 0x80;
  iVar1 = seglen * 0x19 + t;
  col[iVar1] = in_register_00001211 + 0x80;
  col[iVar1 + seglen] = in_register_00001212 + 0x80;
  iVar1 = seglen * 0x1b + t;
  col[iVar1] = in_register_00001213 + 0x80;
  col[iVar1 + seglen] = in_register_00001214 + 0x80;
  col[iVar1 + seglen * 2] = in_register_00001215 + 0x80;
  col[seglen * 0x1e + t] = in_register_00001216 + 0x80;
  col[seglen * 0x1f + t] = in_register_00001217 + 0x80;
  return;
}

Assistant:

static inline void arr_store_col(
        int *col,
        __m256i vH,
        int32_t t,
        int32_t seglen)
{
    col[ 0*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  0);
    col[ 1*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  1);
    col[ 2*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  2);
    col[ 3*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  3);
    col[ 4*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  4);
    col[ 5*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  5);
    col[ 6*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  6);
    col[ 7*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  7);
    col[ 8*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  8);
    col[ 9*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH,  9);
    col[10*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 10);
    col[11*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 11);
    col[12*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 12);
    col[13*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 13);
    col[14*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 14);
    col[15*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 15);
    col[16*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 16);
    col[17*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 17);
    col[18*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 18);
    col[19*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 19);
    col[20*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 20);
    col[21*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 21);
    col[22*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 22);
    col[23*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 23);
    col[24*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 24);
    col[25*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 25);
    col[26*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 26);
    col[27*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 27);
    col[28*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 28);
    col[29*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 29);
    col[30*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 30);
    col[31*seglen+t] = (int8_t)_mm256_extract_epi8_rpl(vH, 31);
}